

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O0

int s3gaucnt_write(char *fn,vector_t ***wt_mean,vector_t ***wt_var,int32 pass2var,float32 ***dnom,
                  uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  int32 iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_74;
  uint local_70;
  uint32 has_vars;
  uint32 has_means;
  uint32 j;
  uint32 blk;
  uint32 n_elem;
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  float32 ***pppfStack_48;
  uint32 n_cb_local;
  float32 ***dnom_local;
  vector_t ***ppppfStack_38;
  int32 pass2var_local;
  vector_t ***wt_var_local;
  vector_t ***wt_mean_local;
  char *fn_local;
  
  n_elem = 0;
  blk = 0;
  fp._4_4_ = n_cb;
  pppfStack_48 = dnom;
  dnom_local._4_4_ = pass2var;
  ppppfStack_38 = wt_var;
  wt_var_local = wt_mean;
  wt_mean_local = (vector_t ***)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)wt_mean_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    local_70 = (uint)(wt_var_local != (vector_t ***)0x0);
    iVar1 = bio_fwrite(&local_70,4,1,_ignore,0,&n_elem);
    if (iVar1 == 1) {
      local_74 = (uint)(ppppfStack_38 != (vector_t ***)0x0);
      iVar1 = bio_fwrite(&local_74,4,1,_ignore,0,&n_elem);
      if (iVar1 == 1) {
        iVar1 = bio_fwrite((void *)((long)&dnom_local + 4),4,1,_ignore,0,&n_elem);
        if (iVar1 == 1) {
          iVar1 = bio_fwrite((void *)((long)&fp + 4),4,1,_ignore,0,&n_elem);
          if (iVar1 == 1) {
            iVar1 = bio_fwrite(&n_density,4,1,_ignore,0,&n_elem);
            if (iVar1 == 1) {
              iVar2 = bio_fwrite_1d(veclen,4,n_feat,_ignore,&n_elem);
              if (iVar2 < 0) {
                fn_local._4_4_ = -1;
              }
              else {
                has_means = 0;
                for (has_vars = 0; has_vars < n_feat; has_vars = has_vars + 1) {
                  has_means = veclen[has_vars] + has_means;
                }
                j = fp._4_4_ * n_density * has_means;
                if (local_70 != 0) {
                  band_nz_1d((float32 *)***wt_var_local,j,1.2e-38);
                  iVar2 = bio_fwrite_1d(***wt_var_local,4,j,_ignore,&n_elem);
                  if (iVar2 < 0) {
                    return -1;
                  }
                }
                if (local_74 != 0) {
                  floor_nz_1d((float32 *)***ppppfStack_38,j,1.2e-38);
                  iVar2 = bio_fwrite_1d(***ppppfStack_38,4,j,_ignore,&n_elem);
                  if (iVar2 < 0) {
                    return -1;
                  }
                }
                floor_nz_3d(pppfStack_48,fp._4_4_,n_feat,n_density,1.2e-38);
                iVar2 = bio_fwrite_3d(pppfStack_48,4,fp._4_4_,n_feat,n_density,_ignore,&n_elem);
                if (iVar2 < 0) {
                  fn_local._4_4_ = -1;
                }
                else {
                  iVar1 = bio_fwrite(&n_elem,4,1,_ignore,0,&blk);
                  if (iVar1 == 1) {
                    s3close(_ignore);
                    pcVar3 = "";
                    if (local_70 != 0) {
                      pcVar3 = " with means";
                    }
                    pcVar4 = "";
                    if (local_74 != 0) {
                      pcVar4 = " with vars";
                    }
                    pcVar5 = "";
                    if (local_74 != 0 && dnom_local._4_4_ != 0) {
                      pcVar5 = " (2pass)";
                    }
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                            ,0x1e5,"Wrote %s%s%s%s [%ux%ux%u vector arrays]\n",wt_mean_local,pcVar3,
                            pcVar4,pcVar5,fp._4_4_,n_feat,n_density);
                    fn_local._4_4_ = 0;
                  }
                  else {
                    s3close(_ignore);
                    fn_local._4_4_ = -1;
                  }
                }
              }
            }
            else {
              fn_local._4_4_ = -1;
            }
          }
          else {
            fn_local._4_4_ = -1;
          }
        }
        else {
          fn_local._4_4_ = -1;
        }
      }
      else {
        fn_local._4_4_ = -1;
      }
    }
    else {
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3gaucnt_write(const char *fn,
	       vector_t ***wt_mean,
	       vector_t ***wt_var,
	       int32 pass2var,
	       float32 ***dnom,
	       uint32 n_cb,
	       uint32 n_feat,
	       uint32 n_density,
	       const uint32 *veclen)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    uint32 n_elem, blk, j, has_means, has_vars;

    s3clr_fattr();
    s3add_fattr("version", GAUCNT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;


    if (wt_mean != NULL)
	has_means = TRUE;
    else
	has_means = FALSE;
    if (bio_fwrite((void *)&has_means, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }

    if (wt_var != NULL)
	has_vars = TRUE;
    else
	has_vars = FALSE;
    if (bio_fwrite((void *)&has_vars, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&pass2var, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&n_cb, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&n_density, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fwrite_1d((void *)veclen, sizeof(uint32), n_feat, fp, &chksum) < 0) {
	return S3_ERROR;
    }
    
    for (j = 0, blk = 0; j < n_feat; j++)
	blk += veclen[j];

    n_elem = n_cb * n_density * blk;

    if (has_means) {
	band_nz_1d(wt_mean[0][0][0], n_elem, MIN_POS_FLOAT32);
	
	if (bio_fwrite_1d((void *)wt_mean[0][0][0], sizeof(float32), n_elem, fp, &chksum) < 0)
	    return S3_ERROR;
    }

    if (has_vars) {
	floor_nz_1d(wt_var[0][0][0], n_elem, MIN_POS_FLOAT32);

	if (bio_fwrite_1d((void *)wt_var[0][0][0], sizeof(float32), n_elem, fp, &chksum) < 0)
	    return S3_ERROR;
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(dnom, n_cb, n_feat, n_density, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)dnom, sizeof(float32), n_cb, n_feat, n_density, fp, &chksum) < 0) {
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);
	
	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s%s%s%s [%ux%ux%u vector arrays]\n",
	   fn,
	   (has_means ? " with means" : ""),
	   (has_vars ? " with vars" : ""),
	   (has_vars && pass2var ? " (2pass)" : ""),
	   n_cb, n_feat, n_density);

    return S3_SUCCESS;
}